

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O2

void __thiscall libnbt::NBTTagData<float>::setType(NBTTagData<float> *this)

{
  bool bVar1;
  
  bVar1 = std::type_info::operator==
                    ((type_info *)&float::typeinfo,(type_info *)&signed_char::typeinfo);
  if (bVar1) {
    (this->super_NBTBase).type = '\x01';
  }
  else {
    bVar1 = std::type_info::operator==((type_info *)&float::typeinfo,(type_info *)&short::typeinfo);
    if (bVar1) {
      (this->super_NBTBase).type = '\x02';
    }
    else {
      bVar1 = std::type_info::operator==((type_info *)&float::typeinfo,(type_info *)&int::typeinfo);
      if (bVar1) {
        (this->super_NBTBase).type = '\x03';
      }
      else {
        bVar1 = std::type_info::operator==
                          ((type_info *)&float::typeinfo,(type_info *)&long::typeinfo);
        if (bVar1) {
          (this->super_NBTBase).type = '\x04';
        }
        else {
          bVar1 = std::type_info::operator==
                            ((type_info *)&float::typeinfo,(type_info *)&float::typeinfo);
          if (bVar1) {
            (this->super_NBTBase).type = '\x05';
          }
          else {
            bVar1 = std::type_info::operator==
                              ((type_info *)&float::typeinfo,(type_info *)&double::typeinfo);
            if (bVar1) {
              (this->super_NBTBase).type = '\x06';
            }
            else {
              bVar1 = std::type_info::operator==
                                ((type_info *)&float::typeinfo,
                                 (type_info *)&std::__cxx11::string::typeinfo);
              if (bVar1) {
                (this->super_NBTBase).type = '\b';
              }
              else {
                (this->super_NBTBase).type = '\0';
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void setType() {
            if (typeid(T) == typeid(int8_t)) {
                type = BYTE;
            } else if (typeid(T) == typeid(int16_t)) {
                type = SHORT;
            } else if (typeid(T) == typeid(int32_t)) {
                type = INT;
            } else if (typeid(T) == typeid(int64_t)) {
                type = LONG;
            } else if (typeid(T) == typeid(float)) {
                type = FLOAT;
            } else if (typeid(T) == typeid(double)) {
                type = DOUBLE;
            } else if (typeid(T) == typeid(std::string)) {
                type = STRING;
            } else {
                type = END;
            }
        }